

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.hpp
# Opt level: O2

InterfaceBlockInfo *
glu::getProgramInterfaceBlockInfo
          (InterfaceBlockInfo *__return_storage_ptr__,Functions *gl,deUint32 program,
          deUint32 programInterface,deUint32 index)

{
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->index = 0xffffffff;
  __return_storage_ptr__->bufferBinding = 0;
  __return_storage_ptr__->dataSize = 0;
  (__return_storage_ptr__->activeVariables).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->activeVariables).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->activeVariables).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getProgramInterfaceBlockInfo(gl,program,programInterface,index,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline InterfaceBlockInfo getProgramInterfaceBlockInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index)
{
	InterfaceBlockInfo info;
	getProgramInterfaceBlockInfo(gl, program, programInterface, index, info);
	return info;
}